

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O3

sysbvm_tuple_t sysbvm_byteArray_create(sysbvm_context_t *context,sysbvm_tuple_t size)

{
  sysbvm_object_tuple_t *psVar1;
  sysbvm_type_tuple_t *byteArrayTypeObject;
  sysbvm_tuple_t type;
  
  type = (context->roots).byteArrayType;
  if (size == 0) {
    if (type != 0) {
      if (*(sysbvm_tuple_t *)(type + 0x78) != 0) {
        return *(sysbvm_tuple_t *)(type + 0x78);
      }
      psVar1 = sysbvm_context_allocateByteTuple(context,type,0);
      *(sysbvm_object_tuple_t **)(type + 0x78) = psVar1;
      return (sysbvm_tuple_t)psVar1;
    }
    type = 0;
  }
  psVar1 = sysbvm_context_allocateByteTuple(context,type,size);
  return (sysbvm_tuple_t)psVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_byteArray_create(sysbvm_context_t *context, sysbvm_tuple_t size)
{
    if(size == 0)
    {
        sysbvm_type_tuple_t *byteArrayTypeObject = (sysbvm_type_tuple_t*)context->roots.byteArrayType;
        if(byteArrayTypeObject)
        {
            if(!byteArrayTypeObject->emptyTrivialSingleton)
                byteArrayTypeObject->emptyTrivialSingleton = (sysbvm_tuple_t)sysbvm_context_allocateByteTuple(context, context->roots.byteArrayType, 0);
            return byteArrayTypeObject->emptyTrivialSingleton;
        }
    }

    return (sysbvm_tuple_t)sysbvm_context_allocateByteTuple(context, context->roots.byteArrayType, size);
}